

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_enc.c
# Opt level: O0

int WebPWritePNG(FILE *out_file,WebPDecBuffer *buffer)

{
  int iVar1;
  int iVar2;
  __jmp_buf_tag *__env;
  long in_RSI;
  long in_RDI;
  undefined8 uVar3;
  uint32_t y;
  int has_alpha;
  int stride;
  png_bytep row;
  uint32_t height;
  uint32_t width;
  png_infop info;
  png_structp png;
  uint local_44;
  long local_38;
  uint local_30;
  undefined4 local_2c;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  int local_4;
  
  if ((in_RDI == 0) || (in_RSI == 0)) {
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_20 = png_create_write_struct("1.6.37",0,PNGErrorFunction);
    if (local_20 == 0) {
      local_4 = 0;
    }
    else {
      local_28 = png_create_info_struct(local_20);
      if (local_28 == 0) {
        png_destroy_write_struct(&local_20,0);
        local_4 = 0;
      }
      else {
        __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_20,longjmp,200);
        iVar1 = _setjmp(__env);
        if (iVar1 == 0) {
          png_init_io(local_20,local_10);
          local_2c = *(undefined4 *)(local_18 + 4);
          local_30 = *(uint *)(local_18 + 8);
          local_38 = *(long *)(local_18 + 0x10);
          iVar1 = *(int *)(local_18 + 0x18);
          iVar2 = WebPIsAlphaMode(MODE_RGB);
          uVar3 = 2;
          if (iVar2 != 0) {
            uVar3 = 6;
          }
          png_set_IHDR(local_20,local_28,local_2c,local_30,8,uVar3,0,0,0);
          png_write_info(local_20,local_28);
          for (local_44 = 0; local_44 < local_30; local_44 = local_44 + 1) {
            png_write_rows(local_20,&local_38,1);
            local_38 = local_38 + iVar1;
          }
          png_write_end(local_20,local_28);
          png_destroy_write_struct(&local_20,&local_28);
          local_4 = 1;
        }
        else {
          png_destroy_write_struct(&local_20,&local_28);
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int WebPWritePNG(FILE* out_file, const WebPDecBuffer* const buffer) {
  volatile png_structp png;
  volatile png_infop info;

  if (out_file == NULL || buffer == NULL) return 0;

  png = png_create_write_struct(PNG_LIBPNG_VER_STRING,
                                NULL, PNGErrorFunction, NULL);
  if (png == NULL) {
    return 0;
  }
  info = png_create_info_struct(png);
  if (info == NULL) {
    png_destroy_write_struct((png_structpp)&png, NULL);
    return 0;
  }
  if (setjmp(png_jmpbuf(png))) {
    png_destroy_write_struct((png_structpp)&png, (png_infopp)&info);
    return 0;
  }
  png_init_io(png, out_file);
  {
    const uint32_t width = buffer->width;
    const uint32_t height = buffer->height;
    png_bytep row = buffer->u.RGBA.rgba;
    const int stride = buffer->u.RGBA.stride;
    const int has_alpha = WebPIsAlphaMode(buffer->colorspace);
    uint32_t y;

    png_set_IHDR(png, info, width, height, 8,
                 has_alpha ? PNG_COLOR_TYPE_RGBA : PNG_COLOR_TYPE_RGB,
                 PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
                 PNG_FILTER_TYPE_DEFAULT);
    png_write_info(png, info);
    for (y = 0; y < height; ++y) {
      png_write_rows(png, &row, 1);
      row += stride;
    }
  }
  png_write_end(png, info);
  png_destroy_write_struct((png_structpp)&png, (png_infopp)&info);
  return 1;
}